

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

AMPLS_MP_Solver *
AMPLS__internal__Open
          (unique_ptr<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> p_be,CCallbacks cb)

{
  BasicBackend *pBVar1;
  AMPLS_MP_Solver *pAVar2;
  __uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> *this;
  char *argv [2];
  
  pAVar2 = (AMPLS_MP_Solver *)operator_new(0x18);
  pAVar2->internal_info_ = (void *)0x0;
  pAVar2->solver_info_ = (void *)0x0;
  pAVar2->user_info_ = (void *)0x0;
  this = (__uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> *)
         operator_new(0xb8);
  memset(this,0,0xb8);
  this[1]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl =
       (BasicBackend *)&PTR__OutputHandler_004cc868;
  this[3]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[4]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[5]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[6]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[7]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[8]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[9]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[10]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0xb]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0xc]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0xd]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0xe]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0xf]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
  super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0x10]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
  .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0x11]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
  .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0x12]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
  .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)0x0;
  this[0x13]._M_t.super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
  .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = (BasicBackend *)(this + 0x15);
  pAVar2->internal_info_ = this;
  std::__uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>::operator=
            (this,(__uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> *)
                  p_be._M_t.
                  super___uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
                  .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl);
  pBVar1 = (this->_M_t).
           super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
           super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl;
  *(_func_void_ptr **)(pBVar1 + 0x2e8) = cb.init;
  *(Checker_AMPLS_ModeltTraits *)(pBVar1 + 0x2f0) = cb.check;
  *(undefined4 *)(pBVar1 + 0x2f8) = cb.additionalText._0_4_;
  *(undefined4 *)(pBVar1 + 0x2fc) = cb.additionalText._4_4_;
  *(undefined4 *)(pBVar1 + 0x300) = cb.diagnostics._0_4_;
  *(undefined4 *)(pBVar1 + 0x304) = cb.diagnostics._4_4_;
  *(__uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> **)(pBVar1 + 0x250) =
       this + 1;
  (**(code **)(*(long *)pBVar1 + 0x60))(pBVar1);
  *(undefined4 *)(pBVar1 + 0x180) = 1;
  return pAVar2;
}

Assistant:

AMPLS_MP_Solver* AMPLS__internal__Open(std::unique_ptr<mp::BasicBackend> p_be,
  CCallbacks cb = {}) {
  AMPLS_MP_Solver* slv = new AMPLS_MP_Solver();
  AMPLS__internal__TryCatchWrapper( slv, [&]() {
    auto ii = new AMPLS_MP__internal();
    slv->internal_info_ = ii;
    ii->p_be_ = std::move(p_be);
    auto be = ii->p_be_.get();
    be->GetCallbacks() = cb;
    be->set_output_handler(&ii->output_h_);
    char* argv[] = {(char*)"ampls-driver", nullptr};
    be->Init(argv);
    be->set_wantsol(1);       // user can still modify by 'wantsol=...'
    return 0;
  } );
  return slv;
}